

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O3

void del_tokens(VARR_token_t *tokens,int from,int len)

{
  int iVar1;
  uint uVar2;
  token_t *pptVar3;
  int iVar4;
  
  if (tokens != (VARR_token_t *)0x0) {
    iVar1 = (int)tokens->els_num;
    iVar4 = iVar1 - from;
    if (-1 < len) {
      iVar4 = len;
    }
    uVar2 = iVar1 - (iVar4 + from);
    if (iVar1 < iVar4 + from) goto LAB_0019398a;
    pptVar3 = tokens->varr;
    if (0 < (int)uVar2) {
      memmove(pptVar3 + from,pptVar3 + from + iVar4,(ulong)uVar2 << 3);
      pptVar3 = tokens->varr;
    }
    if ((pptVar3 != (token_t *)0x0) && ((ulong)(long)(iVar1 - iVar4) <= tokens->els_num)) {
      tokens->els_num = (long)(iVar1 - iVar4);
      return;
    }
    del_tokens_cold_1();
  }
  del_tokens_cold_2();
LAB_0019398a:
  __assert_fail("from + len <= tokens_len",
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                ,0xa9b,"void del_tokens(VARR_token_t *, int, int)");
}

Assistant:

static void del_tokens (VARR (token_t) * tokens, int from, int len) {
  int diff, tokens_len = (int) VARR_LENGTH (token_t, tokens);
  token_t *addr = VARR_ADDR (token_t, tokens);

  if (len < 0) len = tokens_len - from;
  assert (from + len <= tokens_len);
  if ((diff = tokens_len - from - len) > 0)
    memmove (addr + from, addr + from + len, diff * sizeof (token_t));
  VARR_TRUNC (token_t, tokens, tokens_len - len);
}